

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ManDumpCnf(Gia_Man_t *p,char *pFileName,int nLutSize,int fCnfObjIds,int fAddOrCla,
                  int fVerbose)

{
  int iVar1;
  Cnf_Dat_t *p_00;
  long lVar2;
  long lVar3;
  timespec ts;
  timespec local_48;
  char *local_38;
  
  local_38 = pFileName;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  p_00 = Mf_ManGenerateCnf(p,nLutSize,fCnfObjIds,fAddOrCla,fVerbose);
  Cnf_DataWriteIntoFile(p_00,local_38,0,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)p_00->nVars,
         (ulong)(uint)p_00->nClauses,(ulong)(uint)p_00->nLiterals);
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  Cnf_DataFree(p_00);
  return;
}

Assistant:

void Mf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose )
{
    abctime clk = Abc_Clock();
    Cnf_Dat_t * pCnf;
    pCnf = Mf_ManGenerateCnf( p, nLutSize, fCnfObjIds, fAddOrCla, fVerbose );
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, NULL, NULL );
//    if ( fVerbose )
    {
        printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Cnf_DataFree(pCnf);
}